

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

optional<unsigned_long> kratos::SSATransformFixVisitor::get_target_scope(Var *var)

{
  pointer psVar1;
  long lVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  char *pcVar4;
  pointer psVar5;
  string *psVar6;
  optional<unsigned_long> oVar7;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  
  psVar5 = (var->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (var->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar4 = "ssa-scope=";
  do {
    if (psVar5 == psVar1) {
      uVar3 = 0;
      goto LAB_001d4dc8;
    }
    psVar6 = &((psVar5->super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              value_str;
    lVar2 = std::__cxx11::string::rfind((char *)psVar6,0x22010d);
    psVar5 = psVar5 + 1;
  } while (lVar2 != 0);
  std::__cxx11::string::substr((ulong)local_50,(ulong)psVar6);
  pcVar4 = (char *)std::__cxx11::stoul((string *)local_50,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)local_50);
  uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_001d4dc8:
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)pcVar4;
  return (optional<unsigned_long>)
         oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static std::optional<uint64_t> get_target_scope(const Var *var) {
        auto const &attrs = var->get_attributes();
        for (auto const &attr : attrs) {
            auto const &value_str = attr->value_str;
            auto pos = value_str.rfind("ssa-scope=");
            if (pos == 0) {
                auto v = value_str.substr(10);
                return std::stoul(v);
            }
        }
        return std::nullopt;
    }